

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_offt_init(Curl_hash *h,size_t slots,Curl_hash_dtor dtor)

{
  Curl_hash_dtor dtor_local;
  size_t slots_local;
  Curl_hash *h_local;
  
  Curl_hash_init(h,slots,Curl_hash_str,Curl_str_key_compare,dtor);
  return;
}

Assistant:

void Curl_hash_offt_init(struct Curl_hash *h,
                         size_t slots,
                         Curl_hash_dtor dtor)
{
  Curl_hash_init(h, slots, Curl_hash_str, Curl_str_key_compare, dtor);
}